

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

shared_ptr<duckdb::PreparedStatementData,_true> __thiscall
duckdb::ClientContext::CreatePreparedStatement
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          values,PreparedStatementMode mode)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  byte bVar3;
  int iVar4;
  pointer pRVar5;
  ClientContextState *pCVar6;
  pointer pSVar7;
  type pPVar8;
  string *extraout_RDX;
  string *query_00;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  byte bVar9;
  shared_ptr<duckdb::ClientContextState,_true> *state_2;
  shared_ptr<duckdb::ClientContextState,_true> *state_1;
  undefined7 in_register_00000089;
  bool bVar10;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  element_type *peVar11;
  shared_ptr<duckdb::PreparedStatementData,_true> sVar12;
  undefined1 in_stack_00000008;
  ErrorData error;
  long *local_100;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *local_f8;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_f0;
  undefined8 local_e8;
  __buckets_ptr local_e0 [5];
  element_type *local_b8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> query_01;
  
  local_e8 = CONCAT71(in_register_00000089,mode);
  local_f8 = values.ptr;
  local_f0 = statement;
  pRVar5 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
           ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                         *)(lock + 5));
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)
             &stack0xffffffffffffff48,pRVar5);
  _Var2._M_pi = _Stack_b0._M_pi;
  if (local_b8 == (element_type *)_Stack_b0._M_pi) {
    ::std::
    vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
               *)&stack0xffffffffffffff48);
    query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_05;
  }
  else {
    bVar9 = 0;
    peVar11 = local_b8;
    do {
      pCVar6 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                         ((shared_ptr<duckdb::ClientContextState,_true> *)peVar11);
      bVar3 = (**(code **)(*(long *)pCVar6 + 0x50))(pCVar6);
      bVar9 = bVar9 | bVar3;
      peVar11 = (element_type *)&peVar11->db;
    } while (peVar11 != (element_type *)_Var2._M_pi);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
               *)&stack0xffffffffffffff48);
    query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if ((bVar9 & 1) != 0) {
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pSVar7 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)local_f8);
      (*pSVar7->_vptr_SQLStatement[3])(&local_100,pSVar7);
      sVar12 = CreatePreparedStatementInternal
                         ((ClientContext *)&stack0xffffffffffffff48,lock,query_00,local_f0,
                          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                           *)&local_100);
      _Var2._M_pi = _Stack_b0._M_pi;
      peVar11 = local_b8;
      query_01._M_pi =
           sVar12.internal.
           super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      local_b8 = (element_type *)0x0;
      _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
               super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
         query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00,
         (element_type *)_Stack_b0._M_pi != (element_type *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_b0._M_pi);
        query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
      }
      if (local_100 != (long *)0x0) {
        (**(code **)(*local_100 + 8))();
        query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
      }
      local_100 = (long *)0x0;
      bVar10 = false;
      if ((this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pRVar5 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                 ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                               *)(lock + 5));
        RegisteredStateManager::States
                  ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)
                   &stack0xffffffffffffff48,pRVar5);
        _Var2._M_pi = _Stack_b0._M_pi;
        for (peVar11 = local_b8; peVar11 != (element_type *)_Var2._M_pi;
            peVar11 = (element_type *)&peVar11->db) {
          pCVar6 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                             ((shared_ptr<duckdb::ClientContextState,_true> *)peVar11);
          pPVar8 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                             ((shared_ptr<duckdb::PreparedStatementData,_true> *)this);
          iVar4 = (**(code **)(*(long *)pCVar6 + 0x60))(pCVar6,lock,pPVar8,in_stack_00000008);
          if (iVar4 == 1) {
            bVar10 = true;
          }
        }
        ::std::
        vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
        ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                   *)&stack0xffffffffffffff48);
        query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      }
      if (!bVar10) goto LAB_0164bbad;
      p_Var1 = (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
               super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04;
      }
    }
  }
  local_e0[0] = (local_f8->_M_h)._M_buckets;
  (local_f8->_M_h)._M_buckets = (__buckets_ptr)0x0;
  sVar12 = CreatePreparedStatementInternal
                     (this,lock,(string *)query_01._M_pi,local_f0,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                       *)local_e0);
  query_01._M_pi =
       sVar12.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_e0[0] != (__buckets_ptr)0x0) {
    (*(code *)(*local_e0[0])[1]._M_nxt)();
    query_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_06;
  }
LAB_0164bbad:
  sVar12.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = query_01._M_pi;
  sVar12.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::PreparedStatementData,_true>)
         sVar12.internal.
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<PreparedStatementData>
ClientContext::CreatePreparedStatement(ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
                                       optional_ptr<case_insensitive_map_t<BoundParameterData>> values,
                                       PreparedStatementMode mode) {
	// check if any client context state could request a rebind
	bool can_request_rebind = false;
	for (auto &state : registered_state->States()) {
		if (state->CanRequestRebind()) {
			can_request_rebind = true;
		}
	}
	if (can_request_rebind) {
		bool rebind = false;
		// if any registered state can request a rebind we do the binding on a copy first
		shared_ptr<PreparedStatementData> result;
		try {
			result = CreatePreparedStatementInternal(lock, query, statement->Copy(), values);
		} catch (std::exception &ex) {
			ErrorData error(ex);
			// check if any registered client context state wants to try a rebind
			for (auto &state : registered_state->States()) {
				auto info = state->OnPlanningError(*this, *statement, error);
				if (info == RebindQueryInfo::ATTEMPT_TO_REBIND) {
					rebind = true;
				}
			}
			if (!rebind) {
				throw;
			}
		}
		if (result) {
			D_ASSERT(!rebind);
			for (auto &state : registered_state->States()) {
				auto info = state->OnFinalizePrepare(*this, *result, mode);
				if (info == RebindQueryInfo::ATTEMPT_TO_REBIND) {
					rebind = true;
				}
			}
		}
		if (!rebind) {
			return result;
		}
		// an extension wants to do a rebind - do it once
	}

	return CreatePreparedStatementInternal(lock, query, std::move(statement), values);
}